

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

bool __thiscall
node::BlockManager::ReadRawBlockFromDisk
          (BlockManager *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *block,
          FlatFilePos *pos)

{
  pointer puVar1;
  string_view source_file;
  string_view source_file_00;
  bool bVar2;
  FILE *pFVar3;
  Logger *pLVar4;
  size_t sVar5;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  string_view str;
  string_view str_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  uint blk_size;
  FlatFilePos hpos;
  MessageStartChars blk_start;
  uint32_t obj;
  string log_msg;
  Level in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  char *in_stack_fffffffffffffe70;
  char (*in_stack_fffffffffffffe78) [21];
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined1 local_16c [12];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  undefined8 uStack_158;
  FlatFilePos local_148;
  uint local_13c;
  string local_138;
  string local_118;
  string local_f8 [4];
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_148 = *pos;
  sVar5 = (ulong)local_148 >> 0x23;
  if (sVar5 == 0) {
    FlatFilePos::ToString_abi_cxx11_(&local_58,pos);
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_01._M_len = 0x5e;
    logging_function_01._M_str = "ReadRawBlockFromDisk";
    logging_function_01._M_len = 0x14;
    LogPrintf_<char[21],std::__cxx11::string>
              (logging_function_01,source_file_01,0x443,(LogFlags)&local_58,
               in_stack_fffffffffffffe68,in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    bVar2 = false;
    goto LAB_00921b76;
  }
  local_148.nPos = local_148.nPos - 8;
  pFVar3 = FlatFileSeq::Open(&this->m_block_file_seq,&local_148,true);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)&local_58,&this->m_xor_key);
  local_160 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p;
  uStack_158 = local_58._M_string_length;
  local_16c._4_8_ = pFVar3;
  if (pFVar3 == (FILE *)0x0) {
    FlatFilePos::ToString_abi_cxx11_(&local_58,pos);
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_02._M_len = 0x5e;
    logging_function_02._M_str = "ReadRawBlockFromDisk";
    logging_function_02._M_len = 0x14;
    LogPrintf_<char[21],std::__cxx11::string>
              (logging_function_02,source_file_02,0x449,(LogFlags)&local_58,
               in_stack_fffffffffffffe68,in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      local_f8[0].field_2._0_8_ =
           CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0]);
      local_f8[0]._M_dataplus._M_p = local_58._M_dataplus._M_p;
LAB_00921b62:
      operator_delete(local_f8[0]._M_dataplus._M_p,local_f8[0].field_2._0_8_ + 1);
    }
LAB_00921b6a:
    bVar2 = false;
  }
  else {
    AutoFile::read((AutoFile *)(local_16c + 4),(int)&local_13c,(void *)0x4,sVar5);
    AutoFile::read((AutoFile *)(local_16c + 4),(int)&local_78,(void *)0x4,sVar5);
    local_16c._0_4_ = (uint)local_78._M_dataplus._M_p;
    sVar5 = (size_t)local_13c;
    if (local_13c != *(uint *)(((this->m_opts).chainparams)->pchMessageStart)._M_elems) {
      FlatFilePos::ToString_abi_cxx11_(local_f8,pos);
      s.m_size = 4;
      s.m_data = (uchar *)&local_13c;
      HexStr_abi_cxx11_(&local_118,s);
      s_00.m_data = &((this->m_opts).chainparams)->pchMessageStart;
      s_00.m_size = 4;
      HexStr_abi_cxx11_(&local_138,s_00);
      pLVar4 = LogInstance();
      bVar2 = BCLog::Logger::Enabled(pLVar4);
      if (bVar2) {
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        tinyformat::format<char[21],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (&local_78,
                   (tinyformat *)"%s: Block magic mismatch for %s: %s versus expected %s\n",
                   "ReadRawBlockFromDisk",(char (*) [21])local_f8,&local_118,&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_58,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        pLVar4 = LogInstance();
        local_78._M_dataplus._M_p = (pointer)0x5e;
        local_78._M_string_length = 0xfa6684;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
        ;
        source_file._M_len = 0x5e;
        str._M_str = local_58._M_dataplus._M_p;
        str._M_len = local_58._M_string_length;
        logging_function._M_str = "ReadRawBlockFromDisk";
        logging_function._M_len = 0x14;
        BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0x456,ALL,Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
LAB_00921ab9:
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
LAB_00921b49:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8[0]._M_dataplus._M_p != &local_f8[0].field_2) goto LAB_00921b62;
      goto LAB_00921b6a;
    }
    if (0x2000000 < (uint)local_78._M_dataplus._M_p) {
      FlatFilePos::ToString_abi_cxx11_(local_f8,pos);
      pLVar4 = LogInstance();
      bVar2 = BCLog::Logger::Enabled(pLVar4);
      if (bVar2) {
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        tinyformat::format<char[21],std::__cxx11::string,unsigned_int,unsigned_long>
                  (&local_78,
                   (tinyformat *)
                   "%s: Block data is larger than maximum deserialization size for %s: %s versus %s\n"
                   ,"ReadRawBlockFromDisk",(char (*) [21])local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_16c,
                   (uint *)&MAX_SIZE,
                   (unsigned_long *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_58,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        pLVar4 = LogInstance();
        local_78._M_dataplus._M_p = (pointer)0x5e;
        local_78._M_string_length = 0xfa6684;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
        ;
        source_file_00._M_len = 0x5e;
        str_00._M_str = local_58._M_dataplus._M_p;
        str_00._M_len = local_58._M_string_length;
        logging_function_00._M_str = "ReadRawBlockFromDisk";
        logging_function_00._M_len = 0x14;
        BCLog::Logger::LogPrintStr(pLVar4,str_00,logging_function_00,source_file_00,0x45c,ALL,Error)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          local_118.field_2._M_allocated_capacity =
               CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                        local_58.field_2._M_local_buf[0]);
          local_118._M_dataplus._M_p = local_58._M_dataplus._M_p;
          goto LAB_00921ab9;
        }
      }
      goto LAB_00921b49;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (block,(ulong)local_78._M_dataplus._M_p & 0xffffffff);
    puVar1 = (block->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    bVar2 = true;
    AutoFile::read((AutoFile *)(local_16c + 4),(int)puVar1,
                   (block->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish + -(long)puVar1,sVar5);
  }
  AutoFile::~AutoFile((AutoFile *)(local_16c + 4));
LAB_00921b76:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool BlockManager::ReadRawBlockFromDisk(std::vector<uint8_t>& block, const FlatFilePos& pos) const
{
    FlatFilePos hpos = pos;
    // If nPos is less than 8 the pos is null and we don't have the block data
    // Return early to prevent undefined behavior of unsigned int underflow
    if (hpos.nPos < 8) {
        LogError("%s: OpenBlockFile failed for %s\n", __func__, pos.ToString());
        return false;
    }
    hpos.nPos -= 8; // Seek back 8 bytes for meta header
    AutoFile filein{OpenBlockFile(hpos, true)};
    if (filein.IsNull()) {
        LogError("%s: OpenBlockFile failed for %s\n", __func__, pos.ToString());
        return false;
    }

    try {
        MessageStartChars blk_start;
        unsigned int blk_size;

        filein >> blk_start >> blk_size;

        if (blk_start != GetParams().MessageStart()) {
            LogError("%s: Block magic mismatch for %s: %s versus expected %s\n", __func__, pos.ToString(),
                         HexStr(blk_start),
                         HexStr(GetParams().MessageStart()));
            return false;
        }

        if (blk_size > MAX_SIZE) {
            LogError("%s: Block data is larger than maximum deserialization size for %s: %s versus %s\n", __func__, pos.ToString(),
                         blk_size, MAX_SIZE);
            return false;
        }

        block.resize(blk_size); // Zeroing of memory is intentional here
        filein.read(MakeWritableByteSpan(block));
    } catch (const std::exception& e) {
        LogError("%s: Read from block file failed: %s for %s\n", __func__, e.what(), pos.ToString());
        return false;
    }

    return true;
}